

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zvgPort.c
# Opt level: O1

uint terminate_1284(void)

{
  uint uVar1;
  uint uVar2;
  
  ZvgIO.ecpFlags._0_1_ = (byte)ZvgIO.ecpFlags & 0xfc;
  out((undefined2)ZvgIO.ecpEcr,0x14);
  ZvgIO.ecpDcrState = ZvgIO.ecpDcrState & 0xf4 | 8;
  out((undefined2)ZvgIO.ecpDcr,ZvgIO.ecpDcrState);
  uVar1 = waitForDsrEQ('@','\0',100);
  if (uVar1 != 0xffffffff) {
    ZvgIO.ecpDcrState = ZvgIO.ecpDcrState | 2;
    out((undefined2)ZvgIO.ecpDcr,ZvgIO.ecpDcrState);
    uVar1 = waitForDsrEQ('@','@',100);
    if (uVar1 != 0xffffffff) {
      uVar2 = CONCAT31((int3)(uVar1 >> 8),ZvgIO.ecpDcrState) & 0xfffffff9 | 4;
      ZvgIO.ecpDcrState = (uchar)uVar2;
      out((undefined2)ZvgIO.ecpDcr,ZvgIO.ecpDcrState);
      return uVar2;
    }
  }
  out((undefined2)ZvgIO.ecpDcr,0xc);
  ZvgIO.ecpFlags._0_1_ = (byte)ZvgIO.ecpFlags & 0xfc;
  ZvgIO.ecpDcrState = '\f';
  return CONCAT31((int3)(uVar1 >> 8),0xc);
}

Assistant:

static uint terminate_1284( void)
{
	ZvgIO.ecpFlags &= ~(ECPF_ECP | ECPF_NIBBLE);		// turn off MODE flags

	// set port back to SPP mode

	outportb( ZvgIO.ecpEcr, ECR_SPP_mode | ECR_nErrIntrEn | ECR_serviceIntr);

	// release 1284 active lines

	scdcr( DCR_HostBusy | DCR_HostClk, DCR_1284_Active);

	// wait for P. to respond. XFlag is also inverted but we're not checking
	// for that.

	if (waitForDsrEQ( DSR_PtrClk, 0, PERIPH_TIMEOUT) == ZVG_TIMEOUT)
		goto WaitTimeout;

	// Ack P.

	cdcr( DCR_HostBusy);

	// Wait for P. to set itself back to compatibility mode

	if (waitForDsrEQ( DSR_PtrClk, DSR_PtrClk, PERIPH_TIMEOUT) == ZVG_TIMEOUT)
		goto WaitTimeout;

	// indicate we're also ready to move on

	sdcr( DCR_HostBusy | DCR_nInit);
	return (errOk);

WaitTimeout:
	compatibility();
	return (errOk);			// terminate always works, even if a timeout occured
}